

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_decode.c
# Opt level: O0

zip_source_t *
zip_source_pkware_decode(zip_t *za,zip_source_t *src,zip_uint16_t em,int flags,char *password)

{
  trad_pkware *ctx_00;
  zip_source_t *s2;
  trad_pkware *ctx;
  char *password_local;
  int flags_local;
  zip_uint16_t em_local;
  zip_source_t *src_local;
  zip_t *za_local;
  
  if (((password == (char *)0x0) || (src == (zip_source_t *)0x0)) || (em != 1)) {
    zip_error_set(&za->error,0x12,0);
    za_local = (zip_t *)0x0;
  }
  else if ((flags & 1U) == 0) {
    ctx_00 = trad_pkware_new(password,&za->error);
    if (ctx_00 == (trad_pkware *)0x0) {
      za_local = (zip_t *)0x0;
    }
    else {
      za_local = (zip_t *)zip_source_layered(za,src,pkware_decrypt,ctx_00);
      if (za_local == (zip_t *)0x0) {
        trad_pkware_free(ctx_00);
        za_local = (zip_t *)0x0;
      }
    }
  }
  else {
    zip_error_set(&za->error,0x18,0);
    za_local = (zip_t *)0x0;
  }
  return (zip_source_t *)za_local;
}

Assistant:

zip_source_t *
zip_source_pkware_decode(zip_t *za, zip_source_t *src, zip_uint16_t em, int flags, const char *password) {
    struct trad_pkware *ctx;
    zip_source_t *s2;

    if (password == NULL || src == NULL || em != ZIP_EM_TRAD_PKWARE) {
        zip_error_set(&za->error, ZIP_ER_INVAL, 0);
        return NULL;
    }
    if (flags & ZIP_CODEC_ENCODE) {
        zip_error_set(&za->error, ZIP_ER_ENCRNOTSUPP, 0);
        return NULL;
    }

    if ((ctx = trad_pkware_new(password, &za->error)) == NULL) {
        return NULL;
    }

    if ((s2 = zip_source_layered(za, src, pkware_decrypt, ctx)) == NULL) {
        trad_pkware_free(ctx);
        return NULL;
    }

    return s2;
}